

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O1

void simple_motion_search_prune_part_features
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,int mi_row,int mi_col,
               BLOCK_SIZE bsize,float *features,int features_to_get)

{
  SIMPLE_MOTION_DATA_TREE *sms_tree_00;
  long lVar1;
  MB_MODE_INFO *pMVar2;
  MB_MODE_INFO *pMVar3;
  int16_t iVar4;
  int mi_ext_col;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  BLOCK_SIZE BVar9;
  BLOCK_SIZE BVar10;
  int sub_idx;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  byte bVar15;
  undefined4 uVar16;
  undefined7 in_register_00000089;
  byte bVar17;
  uint *puVar18;
  int r_idx;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  uint *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int ref_list [1];
  uint local_40;
  
  uVar16 = (undefined4)CONCAT71(in_register_00000089,bsize);
  uVar11 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  bVar15 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar11];
  ref_list[0] = 7;
  if ((cpi->rc).is_src_frame_alt_ref == 0) {
    ref_list[0] = 1;
  }
  bVar17 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar11];
  uVar11 = (ulong)bsize;
  if (((features_to_get & 1U) != 0) && (sms_tree->sms_none_valid == 0)) {
    simple_motion_search_get_best_ref
              (cpi,x,sms_tree,mi_row,mi_col,bsize,ref_list,1,(int)sms_tree + 0x48,
               (int)sms_tree + 0x4c,in_stack_ffffffffffffff78,
               (uint *)CONCAT44(uVar16,in_stack_ffffffffffffff80));
    sms_tree->sms_none_valid = 1;
  }
  if ((features_to_get & 2U) != 0) {
    if ((byte)uVar16 < 10) {
      (*(code *)(&DAT_004dea18 + *(int *)(&DAT_004dea18 + uVar11 * 4)))();
      return;
    }
    if (bsize == BLOCK_64X64) {
      lVar6 = 4;
LAB_001ecc14:
      bVar22 = false;
    }
    else {
      if (bsize == BLOCK_128X128) {
        lVar6 = 5;
        goto LAB_001ecc14;
      }
      lVar6 = 6;
      bVar22 = true;
    }
    BVar9 = BLOCK_INVALID;
    if (!bVar22) {
      BVar9 = subsize_lookup[3][lVar6];
    }
    uVar19 = 0;
    do {
      sms_tree_00 = sms_tree->split[uVar19];
      if (sms_tree_00->sms_none_valid == 0) {
        local_40 = (uint)bVar17;
        uVar14 = 0;
        if ((uVar19 & 1) != 0) {
          uVar14 = (uint)(bVar15 >> 1);
        }
        simple_motion_search_get_best_ref
                  (cpi,x,sms_tree_00,(((uint)(uVar19 >> 1) & 0x7fffffff) * local_40 >> 1) + mi_row,
                   uVar14 + mi_col,BVar9,ref_list,1,(int)sms_tree_00 + 0x48,(int)sms_tree_00 + 0x4c,
                   in_stack_ffffffffffffff78,(uint *)CONCAT44(uVar16,in_stack_ffffffffffffff80));
        sms_tree_00->sms_none_valid = 1;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != 4);
  }
  uVar20 = (uint)bVar17;
  uVar14 = (uint)bVar15;
  if (((features_to_get & 4U) == 0) || (sms_tree->sms_rect_valid != 0)) goto LAB_001ece96;
  if ((byte)uVar16 < 10) {
    (*(code *)(&DAT_004dea40 + *(int *)(&DAT_004dea40 + uVar11 * 4)))();
    return;
  }
  if (bsize == BLOCK_64X64) {
    lVar6 = 4;
LAB_001ecd27:
    bVar22 = false;
  }
  else {
    if (bsize == BLOCK_128X128) {
      lVar6 = 5;
      goto LAB_001ecd27;
    }
    lVar6 = 6;
    bVar22 = true;
  }
  BVar9 = BLOCK_INVALID;
  if (!bVar22) {
    BVar9 = subsize_lookup[1][lVar6];
  }
  puVar18 = sms_tree->sms_rect_feat + 1;
  lVar6 = 1;
  uVar21 = 0;
  do {
    simple_motion_search_get_best_ref
              (cpi,x,sms_tree,(uVar21 >> 1) + mi_row,mi_col,BVar9,ref_list,0,(int)puVar18 + -4,
               (int)puVar18,in_stack_ffffffffffffff78,
               (uint *)CONCAT44(uVar16,in_stack_ffffffffffffff80));
    uVar21 = uVar21 + uVar20;
    puVar18 = puVar18 + 2;
    lVar6 = lVar6 + -1;
  } while (lVar6 == 0);
  if ((byte)uVar16 < 10) {
    (*(code *)(&DAT_004dea68 + *(int *)(&DAT_004dea68 + uVar11 * 4)))();
    return;
  }
  if (bsize == BLOCK_64X64) {
    lVar6 = 4;
LAB_001ece0f:
    bVar22 = false;
  }
  else {
    if (bsize == BLOCK_128X128) {
      lVar6 = 5;
      goto LAB_001ece0f;
    }
    lVar6 = 6;
    bVar22 = true;
  }
  BVar9 = BLOCK_INVALID;
  if (!bVar22) {
    BVar9 = subsize_lookup[2][lVar6];
  }
  puVar18 = sms_tree->sms_rect_feat + 5;
  lVar6 = 1;
  uVar21 = 0;
  do {
    simple_motion_search_get_best_ref
              (cpi,x,sms_tree,mi_row,(uVar21 >> 1) + mi_col,BVar9,ref_list,0,(int)puVar18 + -4,
               (int)puVar18,in_stack_ffffffffffffff78,
               (uint *)CONCAT44(uVar16,in_stack_ffffffffffffff80));
    uVar21 = uVar21 + uVar14;
    puVar18 = puVar18 + 2;
    lVar6 = lVar6 + -1;
  } while (lVar6 == 0);
  sms_tree->sms_rect_valid = 1;
LAB_001ece96:
  if (features != (float *)0x0) {
    uVar11 = 0;
    if ((features_to_get & 1U) != 0) {
      lVar6 = 0;
      do {
        fVar23 = log1pf((float)sms_tree->sms_none_feat[lVar6]);
        features[lVar6] = fVar23;
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      uVar11 = 2;
    }
    if ((features_to_get & 2U) != 0) {
      lVar6 = 0;
      do {
        lVar1 = *(long *)((long)sms_tree->split + lVar6 * 4);
        fVar23 = log1pf((float)*(uint *)(lVar1 + 0x48));
        features[uVar11 + lVar6] = fVar23;
        fVar23 = log1pf((float)*(uint *)(lVar1 + 0x4c));
        features[uVar11 + lVar6 + 1] = fVar23;
        lVar6 = lVar6 + 2;
      } while (lVar6 != 8);
      uVar11 = (ulong)((int)uVar11 + 8);
    }
    BVar9 = (BLOCK_SIZE)uVar16;
    if ((features_to_get & 4U) != 0) {
      lVar6 = 0;
      do {
        fVar23 = log1pf((float)sms_tree->sms_rect_feat[lVar6]);
        BVar9 = (BLOCK_SIZE)uVar16;
        features[uVar11 + lVar6] = fVar23;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      uVar11 = (ulong)((int)uVar11 + 8);
    }
    bVar22 = ((cpi->common).seq_params)->monochrome == '\0';
    uVar21 = bVar22 + 1 + (uint)bVar22;
    iVar8 = (cpi->common).mi_params.mi_stride;
    iVar7 = mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [(cpi->common).mi_params.mi_alloc_bsize];
    iVar5 = mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [(cpi->common).mi_params.mi_alloc_bsize];
    iVar12 = iVar8 * mi_row + mi_col;
    (cpi->common).mi_params.mi_grid_base[iVar12] =
         (cpi->common).mi_params.mi_alloc +
         ((cpi->common).mi_params.mi_alloc_stride * iVar7 + iVar5);
    (x->e_mbd).mi = (cpi->common).mi_params.mi_grid_base + iVar12;
    (x->e_mbd).tx_type_map = (cpi->common).mi_params.tx_type_map + iVar12;
    (x->e_mbd).tx_type_map_stride = iVar8;
    x->mbmi_ext_frame =
         (cpi->mbmi_ext_info).frame_base + (iVar7 * (cpi->mbmi_ext_info).stride + iVar5);
    lVar6 = 0;
    av1_setup_dst_planes
              ((x->e_mbd).plane,bsize,&((cpi->common).cur_frame)->buf,mi_row,mi_col,0,uVar21);
    iVar8 = (cpi->oxcf).border_in_pixels;
    iVar7 = 8 - (iVar8 + mi_row * 4);
    iVar5 = (uVar20 + mi_row) * -4 + -8;
    if (iVar5 < iVar7) {
      iVar5 = iVar7;
    }
    (x->mv_limits).row_min = iVar5;
    iVar7 = (cpi->common).mi_params.mi_rows;
    iVar12 = iVar7 - mi_row;
    iVar5 = iVar12 * 4 + 8;
    iVar12 = iVar8 + (iVar12 - uVar20) * 4 + -8;
    if (iVar12 < iVar5) {
      iVar5 = iVar12;
    }
    iVar13 = 8 - (iVar8 + mi_col * 4);
    iVar12 = (uVar14 + mi_col) * -4 + -8;
    if (iVar12 < iVar13) {
      iVar12 = iVar13;
    }
    (x->mv_limits).row_max = iVar5;
    (x->mv_limits).col_min = iVar12;
    iVar12 = (cpi->common).mi_params.mi_cols;
    iVar13 = iVar12 - mi_col;
    iVar5 = iVar13 * 4 + 8;
    iVar8 = iVar8 + (iVar13 - uVar14) * 4 + -8;
    if (iVar8 < iVar5) {
      iVar5 = iVar8;
    }
    (x->mv_limits).col_max = iVar5;
    do {
      bVar15 = (byte)((uVar20 << 2) >>
                     (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar6 + -0x28) & 0x1f));
      bVar17 = (byte)((uVar14 << 2) >>
                     (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar6 + -0x2c) & 0x1f));
      if (bVar17 < 5) {
        bVar17 = 4;
      }
      *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar6 + 0x90) = bVar17;
      if (bVar15 < 5) {
        bVar15 = 4;
      }
      *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar6 + 0x91) = bVar15;
      lVar6 = lVar6 + 0xa30;
    } while ((ulong)uVar21 * 0xa30 - lVar6 != 0);
    (x->e_mbd).mi_row = mi_row;
    (x->e_mbd).mi_col = mi_col;
    (x->e_mbd).mb_to_top_edge = mi_row * -0x20;
    (x->e_mbd).mb_to_bottom_edge = (iVar7 - (uVar20 + mi_row)) * 0x20;
    (x->e_mbd).mb_to_left_edge = mi_col * -0x20;
    (x->e_mbd).mb_to_right_edge = (iVar12 - (uVar14 + mi_col)) * 0x20;
    av1_setup_src_planes(x,cpi->source,mi_row,mi_col,uVar21,bsize);
    iVar4 = av1_dc_quant_QTX(x->qindex,0,(x->e_mbd).bd);
    iVar8 = (int)iVar4 >> ((char)(x->e_mbd).bd - 8U & 0x1f);
    fVar23 = log1pf((float)(iVar8 * iVar8) * 0.00390625);
    lVar6 = (long)(int)uVar11;
    features[lVar6] = fVar23;
    pMVar2 = (x->e_mbd).left_mbmi;
    pMVar3 = (x->e_mbd).above_mbmi;
    BVar10 = BVar9;
    if (pMVar3 != (MB_MODE_INFO *)0x0) {
      BVar10 = pMVar3->bsize;
    }
    if (pMVar2 != (MB_MODE_INFO *)0x0) {
      BVar9 = pMVar2->bsize;
    }
    fVar23 = 1.0;
    fVar24 = 1.0;
    if (pMVar3 == (MB_MODE_INFO *)0x0) {
      fVar24 = 0.0;
    }
    features[lVar6 + 1] = fVar24;
    features[lVar6 + 2] = (float)""[BVar10];
    features[lVar6 + 3] = (float)""[BVar10];
    if (pMVar2 == (MB_MODE_INFO *)0x0) {
      fVar23 = 0.0;
    }
    features[lVar6 + 4] = fVar23;
    features[lVar6 + 5] = (float)""[BVar9];
    features[lVar6 + 6] = (float)""[BVar9];
  }
  return;
}

Assistant:

static inline void simple_motion_search_prune_part_features(
    AV1_COMP *const cpi, MACROBLOCK *x, SIMPLE_MOTION_DATA_TREE *sms_tree,
    int mi_row, int mi_col, BLOCK_SIZE bsize, float *features,
    int features_to_get) {
  const int w_mi = mi_size_wide[bsize];
  const int h_mi = mi_size_high[bsize];
  assert(mi_size_wide[bsize] == mi_size_high[bsize]);
  assert(bsize >= BLOCK_8X8);
  assert(cpi->ref_frame_flags & av1_ref_frame_flag_list[LAST_FRAME] ||
         cpi->ref_frame_flags & av1_ref_frame_flag_list[ALTREF_FRAME]);

  // Setting up motion search
  const int ref_list[] = { cpi->rc.is_src_frame_alt_ref ? ALTREF_FRAME
                                                        : LAST_FRAME };
  const int num_refs = 1;
  const int use_subpixel = 1;

  // Doing whole block first to update the mv
  if (!sms_tree->sms_none_valid && features_to_get & FEATURE_SMS_NONE_FLAG) {
    simple_motion_search_get_best_ref(cpi, x, sms_tree, mi_row, mi_col, bsize,
                                      ref_list, num_refs, use_subpixel, 1,
                                      &sms_tree->sms_none_feat[0],
                                      &sms_tree->sms_none_feat[1]);
    sms_tree->sms_none_valid = 1;
  }

  // Split subblocks
  if (features_to_get & FEATURE_SMS_SPLIT_FLAG) {
    const BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
    for (int r_idx = 0; r_idx < SUB_PARTITIONS_SPLIT; r_idx++) {
      const int sub_mi_col = mi_col + (r_idx & 1) * w_mi / 2;
      const int sub_mi_row = mi_row + (r_idx >> 1) * h_mi / 2;
      SIMPLE_MOTION_DATA_TREE *sub_tree = sms_tree->split[r_idx];

      if (!sub_tree->sms_none_valid) {
        simple_motion_search_get_best_ref(
            cpi, x, sub_tree, sub_mi_row, sub_mi_col, subsize, ref_list,
            num_refs, use_subpixel, 1, &sub_tree->sms_none_feat[0],
            &sub_tree->sms_none_feat[1]);
        sub_tree->sms_none_valid = 1;
      }
    }
  }

  // Rectangular subblocks
  if (!sms_tree->sms_rect_valid && features_to_get & FEATURE_SMS_RECT_FLAG) {
    // Horz subblock
    BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_HORZ);
    for (int r_idx = 0; r_idx < SUB_PARTITIONS_RECT; r_idx++) {
      const int sub_mi_col = mi_col + 0;
      const int sub_mi_row = mi_row + r_idx * h_mi / 2;

      simple_motion_search_get_best_ref(
          cpi, x, sms_tree, sub_mi_row, sub_mi_col, subsize, ref_list, num_refs,
          use_subpixel, 0, &sms_tree->sms_rect_feat[2 * r_idx],
          &sms_tree->sms_rect_feat[2 * r_idx + 1]);
    }

    // Vert subblock
    subsize = get_partition_subsize(bsize, PARTITION_VERT);
    for (int r_idx = 0; r_idx < SUB_PARTITIONS_RECT; r_idx++) {
      const int sub_mi_col = mi_col + r_idx * w_mi / 2;
      const int sub_mi_row = mi_row + 0;

      simple_motion_search_get_best_ref(
          cpi, x, sms_tree, sub_mi_row, sub_mi_col, subsize, ref_list, num_refs,
          use_subpixel, 0, &sms_tree->sms_rect_feat[4 + 2 * r_idx],
          &sms_tree->sms_rect_feat[4 + 2 * r_idx + 1]);
    }
    sms_tree->sms_rect_valid = 1;
  }

  if (!features) return;

  int f_idx = 0;
  if (features_to_get & FEATURE_SMS_NONE_FLAG) {
    for (int sub_idx = 0; sub_idx < 2; sub_idx++) {
      features[f_idx++] = log1pf((float)sms_tree->sms_none_feat[sub_idx]);
    }
  }

  if (features_to_get & FEATURE_SMS_SPLIT_FLAG) {
    for (int sub_idx = 0; sub_idx < SUB_PARTITIONS_SPLIT; sub_idx++) {
      SIMPLE_MOTION_DATA_TREE *sub_tree = sms_tree->split[sub_idx];
      features[f_idx++] = log1pf((float)sub_tree->sms_none_feat[0]);
      features[f_idx++] = log1pf((float)sub_tree->sms_none_feat[1]);
    }
  }

  if (features_to_get & FEATURE_SMS_RECT_FLAG) {
    for (int sub_idx = 0; sub_idx < 8; sub_idx++) {
      features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[sub_idx]);
    }
  }

  const MACROBLOCKD *xd = &x->e_mbd;
  set_offsets_for_motion_search(cpi, x, mi_row, mi_col, bsize);

  // Q_INDEX
  const int dc_q = av1_dc_quant_QTX(x->qindex, 0, xd->bd) >> (xd->bd - 8);
  features[f_idx++] = log1pf((float)(dc_q * dc_q) / 256.0f);

  // Neighbor stuff
  const int has_above = !!xd->above_mbmi;
  const int has_left = !!xd->left_mbmi;
  const BLOCK_SIZE above_bsize = has_above ? xd->above_mbmi->bsize : bsize;
  const BLOCK_SIZE left_bsize = has_left ? xd->left_mbmi->bsize : bsize;
  features[f_idx++] = (float)has_above;
  features[f_idx++] = (float)mi_size_wide_log2[above_bsize];
  features[f_idx++] = (float)mi_size_high_log2[above_bsize];
  features[f_idx++] = (float)has_left;
  features[f_idx++] = (float)mi_size_wide_log2[left_bsize];
  features[f_idx++] = (float)mi_size_high_log2[left_bsize];
}